

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O1

Sfm_Ntk_t *
Sfm_NtkConstruct(Vec_Wec_t *vFanins,int nPis,int nPos,Vec_Str_t *vFixed,Vec_Str_t *vEmpty,
                Vec_Wrd_t *vTruths,Vec_Int_t *vStarts,Vec_Wrd_t *vTruths2)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  Sfm_Ntk_t *p;
  int *piVar4;
  Vec_Int_t *pVVar5;
  Vec_Wec_t *pVVar6;
  size_t sVar7;
  int iVar8;
  
  Sfm_CheckConsistency(vFanins,nPis,nPos,vFixed);
  p = (Sfm_Ntk_t *)calloc(1,0x1d0);
  iVar1 = vFanins->nSize;
  p->nObjs = iVar1;
  p->nPis = nPis;
  p->nPos = nPos;
  p->nNodes = iVar1 - (nPos + nPis);
  p->vFixed = vFixed;
  p->vEmpty = vEmpty;
  p->vTruths = vTruths;
  iVar1 = vFanins->nSize;
  pVVar5 = vFanins->pArray;
  (p->vFanins).nCap = vFanins->nCap;
  (p->vFanins).nSize = iVar1;
  (p->vFanins).pArray = pVVar5;
  p->vStarts = vStarts;
  p->vTruths2 = vTruths2;
  if (vFanins != (Vec_Wec_t *)0x0) {
    free(vFanins);
  }
  Sfm_CreateFanout(&p->vFanins,&p->vFanouts);
  Sfm_CreateLevel(&p->vFanins,&p->vLevels,vEmpty);
  Sfm_CreateLevelR(&p->vFanouts,&p->vLevelsR,vEmpty);
  uVar2 = p->nObjs;
  if ((p->vCounts).nCap < (int)uVar2) {
    piVar4 = (p->vCounts).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar2 << 2);
    }
    (p->vCounts).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00529e49;
    (p->vCounts).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset((p->vCounts).pArray,0,(ulong)uVar2 * 4);
  }
  (p->vCounts).nSize = uVar2;
  uVar2 = p->nObjs;
  if ((p->vTravIds).nCap < (int)uVar2) {
    piVar4 = (p->vTravIds).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar2 << 2);
    }
    (p->vTravIds).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00529e49;
    (p->vTravIds).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset((p->vTravIds).pArray,0,(ulong)uVar2 * 4);
  }
  (p->vTravIds).nSize = uVar2;
  uVar2 = p->nObjs;
  if ((p->vTravIds2).nCap < (int)uVar2) {
    piVar4 = (p->vTravIds2).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar2 << 2);
    }
    (p->vTravIds2).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00529e49;
    (p->vTravIds2).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset((p->vTravIds2).pArray,0,(ulong)uVar2 * 4);
  }
  (p->vTravIds2).nSize = uVar2;
  iVar1 = p->nObjs;
  uVar3 = (long)iVar1 * 2;
  iVar8 = (int)uVar3;
  if ((p->vId2Var).nCap < iVar8) {
    piVar4 = (p->vId2Var).pArray;
    sVar7 = (long)iVar1 << 3;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(sVar7);
    }
    else {
      piVar4 = (int *)realloc(piVar4,sVar7);
    }
    (p->vId2Var).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_00529e49;
    (p->vId2Var).nCap = iVar8;
  }
  if (0 < iVar1) {
    memset((p->vId2Var).pArray,0xff,(uVar3 & 0xffffffff) << 2);
  }
  (p->vId2Var).nSize = iVar8;
  iVar1 = p->nObjs;
  uVar3 = (long)iVar1 * 2;
  iVar8 = (int)uVar3;
  if ((p->vVar2Id).nCap < iVar8) {
    piVar4 = (p->vVar2Id).pArray;
    sVar7 = (long)iVar1 << 3;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(sVar7);
    }
    else {
      piVar4 = (int *)realloc(piVar4,sVar7);
    }
    (p->vVar2Id).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_00529e49:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vVar2Id).nCap = iVar8;
  }
  if (0 < iVar1) {
    memset((p->vVar2Id).pArray,0xff,(uVar3 & 0xffffffff) << 2);
  }
  (p->vVar2Id).nSize = iVar8;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x10000;
  pVVar5->nSize = 0;
  piVar4 = (int *)malloc(0x40000);
  pVVar5->pArray = piVar4;
  p->vCover = pVVar5;
  pVVar6 = Sfm_CreateCnf(p);
  p->vCnfs = pVVar6;
  return p;
}

Assistant:

Sfm_Ntk_t * Sfm_NtkConstruct( Vec_Wec_t * vFanins, int nPis, int nPos, Vec_Str_t * vFixed, Vec_Str_t * vEmpty, Vec_Wrd_t * vTruths, Vec_Int_t * vStarts, Vec_Wrd_t * vTruths2 )
{
    Sfm_Ntk_t * p;
    Sfm_CheckConsistency( vFanins, nPis, nPos, vFixed );
    p = ABC_CALLOC( Sfm_Ntk_t, 1 );
    p->nObjs    = Vec_WecSize( vFanins );
    p->nPis     = nPis;
    p->nPos     = nPos;
    p->nNodes   = p->nObjs - p->nPis - p->nPos;
    // user data
    p->vFixed   = vFixed;
    p->vEmpty   = vEmpty;
    p->vTruths  = vTruths;
    p->vFanins  = *vFanins;
    p->vStarts  = vStarts;
    p->vTruths2 = vTruths2;
    ABC_FREE( vFanins );
    // attributes
    Sfm_CreateFanout( &p->vFanins, &p->vFanouts );
    Sfm_CreateLevel( &p->vFanins, &p->vLevels, vEmpty );
    Sfm_CreateLevelR( &p->vFanouts, &p->vLevelsR, vEmpty );
    Vec_IntFill( &p->vCounts,   p->nObjs,  0 );
    Vec_IntFill( &p->vTravIds,  p->nObjs,  0 );
    Vec_IntFill( &p->vTravIds2, p->nObjs,  0 );
    Vec_IntFill( &p->vId2Var,   2*p->nObjs, -1 );
    Vec_IntFill( &p->vVar2Id,   2*p->nObjs, -1 );
    p->vCover   = Vec_IntAlloc( 1 << 16 );
    p->vCnfs    = Sfm_CreateCnf( p );
    return p;
}